

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

bool __thiscall
btSoftBody::checkContact
          (btSoftBody *this,btCollisionObjectWrapper *colObjWrap,btVector3 *x,btScalar margin,
          sCti *cti)

{
  btTransform *this_00;
  btMatrix3x3 *m;
  btCollisionObject *pbVar1;
  undefined8 *in_RCX;
  btVector3 *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btScalar dst;
  btTransform *wtr;
  btCollisionShape *shp;
  btVector3 nrm;
  btSparseSdf<3> *in_stack_000000b0;
  btVector3 *v1;
  undefined8 local_74;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  btTransform *in_stack_ffffffffffffffa0;
  btVector3 local_40;
  undefined8 *local_30;
  btVector3 *local_20;
  btCollisionObjectWrapper *local_18;
  
  local_30 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  btVector3::btVector3(&local_40);
  btCollisionObjectWrapper::getCollisionShape(local_18);
  this_00 = btCollisionObjectWrapper::getWorldTransform(local_18);
  m = (btMatrix3x3 *)(*(long *)(in_RDI[0x34].m_floats + 2) + 0x40);
  btTransform::invXform
            (in_stack_ffffffffffffffa0,
             (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar2 = btSparseSdf<3>::Evaluate
                    (in_stack_000000b0,(btVector3 *)this,(btCollisionShape *)colObjWrap,x,margin);
  if (bVar2 < 0.0) {
    pbVar1 = btCollisionObjectWrapper::getCollisionObject(local_18);
    *local_30 = pbVar1;
    btTransform::getBasis(this_00);
    bVar4 = ::operator*(m,in_RDI);
    local_74 = bVar4.m_floats._0_8_;
    local_30[1] = local_74;
    local_30[2] = bVar4.m_floats._8_8_;
    v1 = (btVector3 *)(local_30 + 1);
    ::operator*(m->m_el,in_RDI->m_floats);
    operator-(m->m_el,in_RDI);
    bVar3 = btDot(v1,local_20);
    *(float *)(local_30 + 3) = -bVar3;
  }
  return bVar2 < 0.0;
}

Assistant:

bool				btSoftBody::checkContact(	const btCollisionObjectWrapper* colObjWrap,
											 const btVector3& x,
											 btScalar margin,
											 btSoftBody::sCti& cti) const
{
	btVector3 nrm;
	const btCollisionShape *shp = colObjWrap->getCollisionShape();
//	const btRigidBody *tmpRigid = btRigidBody::upcast(colObjWrap->getCollisionObject());
	//const btTransform &wtr = tmpRigid ? tmpRigid->getWorldTransform() : colObjWrap->getWorldTransform();
	const btTransform &wtr = colObjWrap->getWorldTransform();
	//todo: check which transform is needed here

	btScalar dst = 
		m_worldInfo->m_sparsesdf.Evaluate(	
			wtr.invXform(x),
			shp,
			nrm,
			margin);
	if(dst<0)
	{
		cti.m_colObj = colObjWrap->getCollisionObject();
		cti.m_normal = wtr.getBasis()*nrm;
		cti.m_offset = -btDot( cti.m_normal, x - cti.m_normal * dst );
		return(true);
	}
	return(false);
}